

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF::Mesh> *meshRef,Ref<glTF::Buffer> *bufferRef,
               Ref<glTF::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  pointer *ppRVar1;
  pointer *ppRVar2;
  aiMatrix4x4 *paVar3;
  float fVar4;
  aiBone *paVar5;
  iterator __position;
  pointer pPVar6;
  iterator iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  void *__s;
  void *__s_00;
  void *pvVar19;
  ulong uVar20;
  Ref<glTF::Node> *pRVar21;
  long lVar22;
  bool bVar23;
  iterator __position_00;
  Skin *pSVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  Ref<glTF::Node> RVar29;
  Ref<glTF::Accessor> RVar30;
  Ref<glTF::Accessor> local_d8;
  void *local_c8;
  vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *local_c0;
  aiMesh *local_b8;
  size_t local_b0;
  aiMatrix4x4 tmpMatrix4;
  
  if (aimesh->mNumBones != 0) {
    uVar20 = (ulong)aimesh->mNumVertices;
    uVar27 = uVar20 << 4;
    local_c0 = (vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
               inverseBindMatricesData;
    local_b8 = aimesh;
    __s = operator_new__(uVar27);
    __s_00 = operator_new__(uVar27);
    pvVar19 = operator_new__(uVar20 * 4);
    if (uVar20 != 0) {
      uVar28 = 0;
      local_b0 = uVar27;
      memset(__s,0,uVar27);
      memset(__s_00,0,local_b0);
      do {
        *(undefined4 *)((long)pvVar19 + uVar28 * 4) = 0;
        uVar28 = uVar28 + 1;
      } while (uVar20 != uVar28);
    }
    local_c8 = __s_00;
    if (local_b8->mNumBones != 0) {
      uVar20 = 0;
      do {
        paVar5 = local_b8->mBones[uVar20];
        local_b0 = uVar20;
        RVar29 = glTF::LazyDict<glTF::Node>::Get(&mAsset->nodes,(paVar5->mName).data);
        local_d8.vector =
             (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)RVar29.vector;
        local_d8.index = RVar29.index;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(((_Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)
                     &(local_d8.vector)->
                      super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)->
                    _M_impl).super__Vector_impl_data._M_start[local_d8.index]->jointName);
        pSVar24 = (skinRef->vector->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[skinRef->index];
        pRVar21 = *(Ref<glTF::Node> **)
                   &(pSVar24->jointNames).
                    super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                    ._M_impl;
        __position_00._M_current =
             *(pointer *)
              ((long)&(pSVar24->jointNames).
                      super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
              + 8);
        if (__position_00._M_current == pRVar21) {
          bVar23 = true;
          uVar26 = 0;
        }
        else {
          bVar23 = true;
          uVar20 = 0;
          uVar25 = 1;
          uVar26 = 0;
          do {
            iVar18 = std::__cxx11::string::compare
                               ((string *)
                                &((pRVar21[uVar20].vector)->
                                 super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[pRVar21[uVar20].index]->
                                 jointName);
            if (iVar18 == 0) {
              bVar23 = false;
              uVar26 = uVar25 - 1;
            }
            uVar20 = (ulong)uVar25;
            pSVar24 = (skinRef->vector->
                      super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[skinRef->index];
            pRVar21 = *(Ref<glTF::Node> **)
                       &(pSVar24->jointNames).
                        super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                        ._M_impl;
            __position_00._M_current =
                 *(pointer *)
                  ((long)&(pSVar24->jointNames).
                          super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                  + 8);
            uVar25 = uVar25 + 1;
            __s_00 = local_c8;
          } while (uVar20 < (ulong)((long)__position_00._M_current - (long)pRVar21 >> 4));
        }
        if (bVar23) {
          if (__position_00._M_current ==
              *(pointer *)
               ((long)&(pSVar24->jointNames).
                       super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
               + 0x10)) {
            std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
            _M_realloc_insert<glTF::Ref<glTF::Node>const&>
                      ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                       &pSVar24->jointNames,__position_00,(Ref<glTF::Node> *)&local_d8);
          }
          else {
            (__position_00._M_current)->vector =
                 (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)local_d8.vector;
            *(ulong *)&(__position_00._M_current)->index = CONCAT44(local_d8._12_4_,local_d8.index);
            ppRVar2 = (pointer *)
                      ((long)&(pSVar24->jointNames).
                              super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                      + 8);
            *ppRVar2 = *ppRVar2 + 1;
          }
          paVar3 = &paVar5->mOffsetMatrix;
          tmpMatrix4.a1 = paVar3->a1;
          tmpMatrix4.a2 = (paVar5->mOffsetMatrix).a2;
          fVar14 = paVar3->a1;
          fVar15 = paVar3->a2;
          tmpMatrix4.a3 = (paVar5->mOffsetMatrix).a3;
          tmpMatrix4.a4 = (paVar5->mOffsetMatrix).a4;
          fVar16 = (paVar5->mOffsetMatrix).a3;
          fVar17 = (paVar5->mOffsetMatrix).a4;
          tmpMatrix4.b1 = (paVar5->mOffsetMatrix).b1;
          tmpMatrix4.b2 = (paVar5->mOffsetMatrix).b2;
          fVar12 = (paVar5->mOffsetMatrix).b1;
          fVar13 = (paVar5->mOffsetMatrix).b2;
          tmpMatrix4.b3 = (paVar5->mOffsetMatrix).b3;
          tmpMatrix4.b4 = (paVar5->mOffsetMatrix).b4;
          tmpMatrix4.c1 = (paVar5->mOffsetMatrix).c1;
          tmpMatrix4.c2 = (paVar5->mOffsetMatrix).c2;
          tmpMatrix4.c3 = (paVar5->mOffsetMatrix).c3;
          tmpMatrix4.c4 = (paVar5->mOffsetMatrix).c4;
          fVar10 = (paVar5->mOffsetMatrix).c3;
          fVar11 = (paVar5->mOffsetMatrix).c4;
          tmpMatrix4.d1 = (paVar5->mOffsetMatrix).d1;
          tmpMatrix4.d2 = (paVar5->mOffsetMatrix).d2;
          fVar4 = (paVar5->mOffsetMatrix).d2;
          tmpMatrix4.d3 = (paVar5->mOffsetMatrix).d3;
          tmpMatrix4.d4 = (paVar5->mOffsetMatrix).d4;
          fVar8 = (paVar5->mOffsetMatrix).d3;
          fVar9 = (paVar5->mOffsetMatrix).d4;
          __position._M_current = *(aiMatrix4x4t<float> **)(local_c0 + 8);
          if (__position._M_current == *(aiMatrix4x4t<float> **)(local_c0 + 0x10)) {
            std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
            _M_realloc_insert<aiMatrix4x4t<float>const&>(local_c0,__position,&tmpMatrix4);
          }
          else {
            (__position._M_current)->d1 = (paVar5->mOffsetMatrix).d1;
            (__position._M_current)->d2 = fVar4;
            (__position._M_current)->d3 = fVar8;
            (__position._M_current)->d4 = fVar9;
            (__position._M_current)->c1 = tmpMatrix4.c1;
            (__position._M_current)->c2 = tmpMatrix4.c2;
            (__position._M_current)->c3 = fVar10;
            (__position._M_current)->c4 = fVar11;
            (__position._M_current)->b1 = fVar12;
            (__position._M_current)->b2 = fVar13;
            (__position._M_current)->b3 = tmpMatrix4.b3;
            (__position._M_current)->b4 = tmpMatrix4.b4;
            (__position._M_current)->a1 = fVar14;
            (__position._M_current)->a2 = fVar15;
            (__position._M_current)->a3 = fVar16;
            (__position._M_current)->a4 = fVar17;
            *(long *)(local_c0 + 8) = *(long *)(local_c0 + 8) + 0x40;
          }
          uVar26 = (int)((ulong)((long)*(pointer *)(local_c0 + 8) - *(long *)local_c0) >> 6) - 1;
        }
        if (paVar5->mNumWeights != 0) {
          uVar20 = 0;
          do {
            uVar27 = (ulong)paVar5->mWeights[uVar20].mVertexId;
            iVar18 = *(int *)((long)pvVar19 + uVar27 * 4);
            lVar22 = (long)iVar18;
            if (lVar22 < 4) {
              fVar4 = paVar5->mWeights[uVar20].mWeight;
              *(float *)((long)__s + lVar22 * 4 + uVar27 * 0x10) = (float)uVar26;
              *(float *)((long)__s_00 + lVar22 * 4 + uVar27 * 0x10) = fVar4;
              *(int *)((long)pvVar19 + uVar27 * 4) = iVar18 + 1;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < paVar5->mNumWeights);
        }
        uVar20 = local_b0 + 1;
      } while (uVar20 < local_b8->mNumBones);
    }
    pPVar6 = *(pointer *)
              ((long)&((meshRef->vector->
                       super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[meshRef->index]->primitives).
                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
              + 8);
    RVar30 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,bufferRef,local_b8->mNumVertices,__s,VEC4,VEC4,
                        ComponentType_FLOAT,false);
    tmpMatrix4.a1 = RVar30.vector._0_4_;
    tmpMatrix4.a2 = RVar30.vector._4_4_;
    tmpMatrix4.a3 = (float)RVar30.index;
    if (RVar30.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      iVar7._M_current = *(pointer *)((long)&pPVar6[-1].attributes.joint + 8);
      if (iVar7._M_current == *(pointer *)((long)&pPVar6[-1].attributes.joint + 0x10)) {
        std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
        _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                  ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                   &pPVar6[-1].attributes.joint,iVar7,(Ref<glTF::Accessor> *)&tmpMatrix4);
      }
      else {
        (iVar7._M_current)->vector = RVar30.vector;
        *(ulong *)&(iVar7._M_current)->index = CONCAT44(tmpMatrix4.a4,tmpMatrix4.a3);
        ppRVar1 = (pointer *)((long)&pPVar6[-1].attributes.joint + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    RVar30 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,bufferRef,local_b8->mNumVertices,local_c8,VEC4,VEC4
                        ,ComponentType_FLOAT,false);
    local_d8.vector = RVar30.vector;
    local_d8.index = RVar30.index;
    if (local_d8.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      iVar7._M_current = *(pointer *)((long)&pPVar6[-1].attributes.weight + 8);
      if (iVar7._M_current == *(pointer *)((long)&pPVar6[-1].attributes.weight + 0x10)) {
        std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
        _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                  ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                   &pPVar6[-1].attributes.weight,iVar7,&local_d8);
      }
      else {
        (iVar7._M_current)->vector = local_d8.vector;
        *(ulong *)&(iVar7._M_current)->index = CONCAT44(local_d8._12_4_,local_d8.index);
        ppRVar1 = (pointer *)((long)&pPVar6[-1].attributes.weight + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    operator_delete__(pvVar19);
    operator_delete__(local_c8);
    operator_delete__(__s);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->id;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        p.attributes.joint.push_back( vertexJointAccessor );
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}